

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_Error_empty_utxo_Test::~CoinSelection_SelectCoins_Error_empty_utxo_Test
          (CoinSelection_SelectCoins_Error_empty_utxo_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Error_empty_utxo) {
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 100000000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  std::vector<Utxo> ret;
  EXPECT_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, std::vector<Utxo>(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb), CfdException);
}